

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* ls_abi_cxx11_(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *__return_storage_ptr__,char *dir_name)

{
  DIR *__dirp;
  dirent *pdVar1;
  string s;
  stat sb;
  char buf [512];
  allocator local_2f1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2f0;
  value_type local_2e8;
  stat local_2c8;
  char local_238 [520];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f0 = __return_storage_ptr__;
  __dirp = opendir(dir_name);
  if (__dirp != (DIR *)0x0) {
    while( true ) {
      pdVar1 = readdir(__dirp);
      if (pdVar1 == (dirent *)0x0) break;
      sprintf(local_238,"%s/%s",dir_name,pdVar1->d_name);
      stat(local_238,&local_2c8);
      if ((local_2c8.st_mode & 0xf000) != 0x4000) {
        std::__cxx11::string::string((string *)&local_2e8,pdVar1->d_name,&local_2f1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_2f0,&local_2e8);
        std::__cxx11::string::~string((string *)&local_2e8);
      }
    }
  }
  return local_2f0;
}

Assistant:

Vector<String> ls(const char * dir_name){
    Vector<String> result;
    DIR *mydir = opendir(dir_name);
    if(mydir != NULL){
        char buf[512];
        struct dirent *myfile;
        while((myfile = readdir(mydir)) != NULL){
            struct stat sb;
            sprintf(buf, "%s/%s",dir_name, myfile->d_name);
            stat(buf, &sb);
            if(!S_ISDIR(sb.st_mode)!=0){\
                String s = myfile->d_name;
                result.push_back(s);
            }
        }
    }
    return result;
}